

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

monster_group * summon_group(chunk_conflict *c,wchar_t midx)

{
  monster *mon;
  monster_group_info *pmVar1;
  wchar_t wVar2;
  
  mon = cave_monster(c,midx);
  if (mon == (monster *)0x0) {
    return (monster_group *)0x0;
  }
  if (mon->group_info[0].role == MON_GROUP_LEADER) {
    pmVar1 = mon->group_info;
  }
  else {
    wVar2 = mon->group_info[1].index;
    if (wVar2 != L'\0') goto LAB_00165f78;
    pmVar1 = mon->group_info + 1;
    monster_group_start(c,mon,L'\x01');
  }
  wVar2 = pmVar1->index;
LAB_00165f78:
  return c->monster_groups[wVar2];
}

Assistant:

struct monster_group *summon_group(struct chunk *c, int midx)
{
	struct monster *mon = cave_monster(c, midx);
	int index;

	if (!mon) return NULL;

	/* If the monster is leader of its primary group, return that group */
	if (mon->group_info[PRIMARY_GROUP].role == MON_GROUP_LEADER) {
		index = mon->group_info[PRIMARY_GROUP].index;
	} else {
		/* Get the (distinct) summon group */
		index = mon->group_info[SUMMON_GROUP].index;

		/* Make a group if there isn't one already */
		if (!index) {
			monster_group_start(c, mon, 1);
			index = mon->group_info[SUMMON_GROUP].index;
		}
	}

	return monster_group_by_index(c, index);
}